

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_setSaneConfig
              (char *organization,char *appName,char *archiveExt,int includeCdRoms,int archivesFirst
              )

{
  int iVar1;
  char *newDir;
  char *newDir_00;
  char **list;
  char *local_68;
  setSaneCfgEnumData data;
  char **i;
  char **cds;
  char *prefdir;
  char *basedir;
  int archivesFirst_local;
  int includeCdRoms_local;
  char *archiveExt_local;
  char *appName_local;
  char *organization_local;
  
  if (initialized == 0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_INITIALIZED);
    organization_local._4_4_ = 0;
  }
  else {
    newDir = PHYSFS_getPrefDir(organization,appName);
    if (newDir == (char *)0x0) {
      organization_local._4_4_ = 0;
    }
    else {
      newDir_00 = PHYSFS_getBaseDir();
      if (newDir_00 == (char *)0x0) {
        organization_local._4_4_ = 0;
      }
      else {
        iVar1 = PHYSFS_setWriteDir(newDir);
        if (iVar1 == 0) {
          PHYSFS_setErrorCode(PHYSFS_ERR_NO_WRITE_DIR);
          organization_local._4_4_ = 0;
        }
        else {
          PHYSFS_mount(newDir,(char *)0x0,0);
          PHYSFS_mount(newDir_00,(char *)0x0,1);
          if (includeCdRoms != 0) {
            list = PHYSFS_getCdRomDirs();
            for (data._16_8_ = list; *(long *)data._16_8_ != 0; data._16_8_ = data._16_8_ + 8) {
              PHYSFS_mount(*(char **)data._16_8_,(char *)0x0,1);
            }
            PHYSFS_freeList(list);
          }
          if (archiveExt != (char *)0x0) {
            memset(&local_68,0,0x18);
            local_68 = archiveExt;
            data.archiveExt = (char *)strlen(archiveExt);
            data.archiveExtLen._4_4_ = 0;
            data.archiveExtLen._0_4_ = archivesFirst;
            PHYSFS_enumerate("/",setSaneCfgEnumCallback,&local_68);
          }
          organization_local._4_4_ = 1;
        }
      }
    }
  }
  return organization_local._4_4_;
}

Assistant:

int PHYSFS_setSaneConfig(const char *organization, const char *appName,
                         const char *archiveExt, int includeCdRoms,
                         int archivesFirst)
{
    const char *basedir;
    const char *prefdir;

    BAIL_IF(!initialized, PHYSFS_ERR_NOT_INITIALIZED, 0);

    prefdir = PHYSFS_getPrefDir(organization, appName);
    BAIL_IF_ERRPASS(!prefdir, 0);

    basedir = PHYSFS_getBaseDir();
    BAIL_IF_ERRPASS(!basedir, 0);

    BAIL_IF(!PHYSFS_setWriteDir(prefdir), PHYSFS_ERR_NO_WRITE_DIR, 0);

    /* !!! FIXME: these can fail and we should report that... */

    /* Put write dir first in search path... */
    PHYSFS_mount(prefdir, NULL, 0);

    /* Put base path on search path... */
    PHYSFS_mount(basedir, NULL, 1);

    /* handle CD-ROMs... */
    if (includeCdRoms)
    {
        char **cds = PHYSFS_getCdRomDirs();
        char **i;
        for (i = cds; *i != NULL; i++)
            PHYSFS_mount(*i, NULL, 1);
        PHYSFS_freeList(cds);
    } /* if */

    /* Root out archives, and add them to search path... */
    if (archiveExt != NULL)
    {
        setSaneCfgEnumData data;
        memset(&data, '\0', sizeof (data));
        data.archiveExt = archiveExt;
        data.archiveExtLen = strlen(archiveExt);
        data.archivesFirst = archivesFirst;
        data.errcode = PHYSFS_ERR_OK;
        if (!PHYSFS_enumerate("/", setSaneCfgEnumCallback, &data))
        {
            /* !!! FIXME: use this if we're reporting errors.
            PHYSFS_ErrorCode errcode = currentErrorCode();
            if (errcode == PHYSFS_ERR_APP_CALLBACK)
                errcode = data->errcode; */
        } /* if */
    } /* if */

    return 1;
}